

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

bool __thiscall
wasm::OptimizeInstructions::isSignExted(OptimizeInstructions *this,Expression *curr,Index bits)

{
  Id IVar1;
  bool bVar2;
  Index IVar3;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> in_RCX;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_110;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_d0;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_90;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_68;
  undefined8 local_58;
  undefined4 local_50;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_48;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_30;
  Expression *extended;
  int32_t leftShift;
  int32_t rightShift;
  
  if ((curr->type).id == 2) {
    IVar1 = curr->_id;
    if (IVar1 == UnaryId) {
      if (curr[1]._id - TableSizeId < 2) {
        in_RCX = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)curr[1].type.id;
      }
      else {
        in_RCX = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0;
      }
    }
    if (IVar1 == UnaryId) goto LAB_008029b3;
    local_110.submatchers.curr.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::AnyKind<int>_> *)&extended;
    extended._0_4_ = 0;
    local_d0.submatchers.curr.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::AnyKind<int>_> *)((long)&extended + 4);
    extended._4_4_ = 0;
    local_68.binder = &local_30;
    local_30 = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0;
    local_90.submatchers.curr = &local_68;
    local_90.submatchers.next.curr = &local_110;
    local_110.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_110.binder = (matched_t<wasm::Const_*> *)0x0;
    local_48.curr = &local_90;
    local_90.binder =
         (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
    local_90.data = ShlInt32;
    local_48.next.curr = &local_d0;
    local_d0.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_d0.binder = (matched_t<wasm::Const_*> *)0x0;
    local_58 = 0;
    local_50 = 0xb;
    if ((((IVar1 == BinaryId) && (curr[1]._id == GlobalSetId)) &&
        (bVar2 = Match::Internal::
                 Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                 ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                          )curr,&local_48), bVar2)) &&
       (((int)extended == extended._4_4_ && (in_RCX = local_30, (int)extended != 0))))
    goto LAB_008029b3;
  }
  in_RCX = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0;
LAB_008029b3:
  if (in_RCX == (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0) {
    if (curr->_id != LocalGetId) {
      return false;
    }
    IVar3 = (this->localInfo).super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>.
            _M_impl.super__Vector_impl_data._M_start[curr[1]._id].signExtedBits;
  }
  else {
    IVar3 = Properties::getSignExtBits(curr);
  }
  return IVar3 == bits;
}

Assistant:

bool isSignExted(Expression* curr, Index bits) {
    if (Properties::getSignExtValue(curr)) {
      return Properties::getSignExtBits(curr) == bits;
    }
    if (auto* get = curr->dynCast<LocalGet>()) {
      // check what we know about the local
      return localInfo[get->index].signExtedBits == bits;
    }
    return false;
  }